

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::DependencyVisitor::visit_block(DependencyVisitor *this,CombinationalStmtBlock *block)

{
  _Hashtable<kratos::Stmt*,kratos::Stmt*,std::allocator<kratos::Stmt*>,std::__detail::_Identity,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var1;
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  undefined8 *puVar2;
  undefined1 local_e8 [8];
  CombinationBlockVisitor visitor;
  CombinationalStmtBlock *block_local;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8 = (undefined1  [8])&PTR_visit_root_002a9378;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.vars_._M_h._M_rehash_policy._M_next_resize;
  visitor.vars_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.vars_._M_h._M_bucket_count = 0;
  visitor.vars_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.vars_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.vars_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.vars_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.vars_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.vars_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.linked_vars_._M_h._M_rehash_policy._M_next_resize;
  visitor.linked_vars_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.linked_vars_._M_h._M_bucket_count = 0;
  visitor.linked_vars_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.linked_vars_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.linked_vars_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.linked_vars_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.linked_vars_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.linked_vars_._M_h._M_single_bucket = (__node_base_ptr)block;
  IRVisitor::visit_root((IRVisitor *)local_e8,(IRNode *)block);
  for (puVar2 = (undefined8 *)visitor.vars_._M_h._M_bucket_count; puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    p_Var1 = (_Hashtable<kratos::Stmt*,kratos::Stmt*,std::allocator<kratos::Stmt*>,std::__detail::_Identity,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)std::__detail::
                _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->dependency_,(key_type *)(puVar2 + 1));
    std::
    _Hashtable<kratos::Stmt*,kratos::Stmt*,std::allocator<kratos::Stmt*>,std::__detail::_Identity,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<kratos::CombinationalStmtBlock*&>
              (p_Var1,&visitor.linked_vars_._M_h._M_single_bucket);
  }
  for (puVar2 = (undefined8 *)visitor.linked_vars_._M_h._M_bucket_count; puVar2 != (undefined8 *)0x0
      ; puVar2 = (undefined8 *)*puVar2) {
    this_00 = (_Insert_base<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)std::__detail::
                 _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->linked_dependency_,(key_type *)(puVar2 + 1));
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    insert<std::__detail::_Node_const_iterator<std::pair<unsigned_int_const,kratos::Var*>,false,false>>
              (this_00,(_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>
                        )((_Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                           *)(puVar2 + 4))->_M_cur,
               (_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>)0x0
              );
  }
  CombinationBlockVisitor::~CombinationBlockVisitor((CombinationBlockVisitor *)local_e8);
  return;
}

Assistant:

void visit_block(CombinationalStmtBlock *block) {
        CombinationBlockVisitor visitor;
        visitor.visit_root(block);
        auto const &vars = visitor.vars();
        for (auto const &var : vars) dependency_[var].emplace(block);
        for (auto const &[var, entry] : visitor.linked_vars()) {
            linked_dependency_[var].insert(entry.begin(), entry.end());
        }
    }